

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ecdh_calc_secret(ptls_iovec_t *out,EC_GROUP *group,EC_KEY *privkey,EC_POINT *peer_point)

{
  int iVar1;
  size_t __size;
  uint8_t *out_00;
  int local_3c;
  int ret;
  ptls_iovec_t secret;
  EC_POINT *peer_point_local;
  EC_KEY *privkey_local;
  EC_GROUP *group_local;
  ptls_iovec_t *out_local;
  
  iVar1 = EC_GROUP_get_degree((EC_GROUP *)group);
  __size = (size_t)((iVar1 + 7) / 8);
  out_00 = (uint8_t *)malloc(__size);
  if (out_00 == (uint8_t *)0x0) {
    local_3c = 0x201;
  }
  else {
    iVar1 = ECDH_compute_key(out_00,__size,(EC_POINT *)peer_point,(EC_KEY *)privkey,(KDF *)0x0);
    if (iVar1 < 1) {
      local_3c = 0x28;
    }
    else {
      local_3c = 0;
    }
  }
  if (local_3c == 0) {
    out->base = out_00;
    out->len = __size;
  }
  else {
    free(out_00);
    out->base = (uint8_t *)0x0;
    out->len = 0;
  }
  return local_3c;
}

Assistant:

static int ecdh_calc_secret(ptls_iovec_t *out, const EC_GROUP *group, EC_KEY *privkey, EC_POINT *peer_point)
{
    ptls_iovec_t secret;
    int ret;

    secret.len = (EC_GROUP_get_degree(group) + 7) / 8;
    if ((secret.base = malloc(secret.len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (ECDH_compute_key(secret.base, secret.len, peer_point, privkey, NULL) <= 0) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE; /* ??? */
        goto Exit;
    }
    ret = 0;

Exit:
    if (ret == 0) {
        *out = secret;
    } else {
        free(secret.base);
        *out = (ptls_iovec_t){NULL};
    }
    return ret;
}